

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O0

int Ivy_FraigNodeIsConst(Ivy_FraigMan_t *p,Ivy_Obj_t *pNew)

{
  int iVar1;
  sat_solver *psVar2;
  double *pdVar3;
  abctime aVar4;
  abctime aVar5;
  int RetValue;
  abctime clk;
  lit local_28;
  int RetValue1;
  int pLits [2];
  Ivy_Obj_t *pNew_local;
  Ivy_FraigMan_t *p_local;
  
  pLits = (int  [2])pNew;
  iVar1 = Ivy_IsComplement(pNew);
  if (iVar1 != 0) {
    __assert_fail("!Ivy_IsComplement(pNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyFraig.c"
                  ,0x8e1,"int Ivy_FraigNodeIsConst(Ivy_FraigMan_t *, Ivy_Obj_t *)");
  }
  if (pLits != (int  [2])p->pManFraig->pConst1) {
    p->nSatCalls = p->nSatCalls + 1;
    if (p->pSat == (sat_solver *)0x0) {
      psVar2 = sat_solver_new();
      p->pSat = psVar2;
      sat_solver_setnvars(p->pSat,1000);
      pdVar3 = (double *)calloc((long)p->pSat->cap,8);
      p->pSat->factors = pdVar3;
      p->nSatVars = 1;
    }
    Ivy_FraigNodeAddToSolver(p,(Ivy_Obj_t *)0x0,(Ivy_Obj_t *)pLits);
    Ivy_FraigSetActivityFactors(p,(Ivy_Obj_t *)0x0,(Ivy_Obj_t *)pLits);
    aVar4 = Abc_Clock();
    iVar1 = Ivy_ObjSatNum((Ivy_Obj_t *)pLits);
    local_28 = toLitCond(iVar1,*(uint *)((long)pLits + 8) >> 7 & 1);
    iVar1 = sat_solver_solve(p->pSat,&local_28,&RetValue1,(long)p->pParams->nBTLimitMiter,0,
                             p->nBTLimitGlobal,p->nInsLimitGlobal);
    aVar5 = Abc_Clock();
    p->timeSat = (aVar5 - aVar4) + p->timeSat;
    if (iVar1 == -1) {
      aVar5 = Abc_Clock();
      p->timeSatUnsat = (aVar5 - aVar4) + p->timeSatUnsat;
      local_28 = lit_neg(local_28);
      iVar1 = sat_solver_addclause(p->pSat,&local_28,&RetValue1);
      if (iVar1 == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyFraig.c"
                      ,0x903,"int Ivy_FraigNodeIsConst(Ivy_FraigMan_t *, Ivy_Obj_t *)");
      }
      p->nSatCallsUnsat = p->nSatCallsUnsat + 1;
      p->nSatProof = p->nSatProof + 1;
      p_local._4_4_ = 1;
    }
    else if (iVar1 == 1) {
      aVar5 = Abc_Clock();
      p->timeSatSat = (aVar5 - aVar4) + p->timeSatSat;
      if (p->pPatWords != (uint *)0x0) {
        Ivy_FraigSavePattern(p);
      }
      p->nSatCallsSat = p->nSatCallsSat + 1;
      p_local._4_4_ = 0;
    }
    else {
      aVar5 = Abc_Clock();
      p->timeSatFail = (aVar5 - aVar4) + p->timeSatFail;
      *(uint *)((long)pLits + 8) = *(uint *)((long)pLits + 8) & 0xfffffeff | 0x100;
      p->nSatFailsReal = p->nSatFailsReal + 1;
      p_local._4_4_ = -1;
    }
    return p_local._4_4_;
  }
  __assert_fail("pNew != p->pManFraig->pConst1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyFraig.c"
                ,0x8e2,"int Ivy_FraigNodeIsConst(Ivy_FraigMan_t *, Ivy_Obj_t *)");
}

Assistant:

int Ivy_FraigNodeIsConst( Ivy_FraigMan_t * p, Ivy_Obj_t * pNew )
{
    int pLits[2], RetValue1;
    abctime clk;
    int RetValue;

    // make sure the nodes are not complemented
    assert( !Ivy_IsComplement(pNew) );
    assert( pNew != p->pManFraig->pConst1 );
    p->nSatCalls++;

    // make sure the solver is allocated and has enough variables
    if ( p->pSat == NULL )
    {
        p->pSat = sat_solver_new();
        sat_solver_setnvars( p->pSat, 1000 );
        p->pSat->factors = ABC_CALLOC( double, p->pSat->cap );
        p->nSatVars = 1;
        // var 0 is reserved for const1 node - add the clause
//        pLits[0] = toLit( 0 );
//        sat_solver_addclause( p->pSat, pLits, pLits + 1 );
    }

    // if the nodes do not have SAT variables, allocate them
    Ivy_FraigNodeAddToSolver( p, NULL, pNew );

    // prepare variable activity
    Ivy_FraigSetActivityFactors( p, NULL, pNew ); 

    // solve under assumptions
clk = Abc_Clock();
    pLits[0] = toLitCond( Ivy_ObjSatNum(pNew), pNew->fPhase );
    RetValue1 = sat_solver_solve( p->pSat, pLits, pLits + 1, 
        (ABC_INT64_T)p->pParams->nBTLimitMiter, (ABC_INT64_T)0, 
        p->nBTLimitGlobal, p->nInsLimitGlobal );
p->timeSat += Abc_Clock() - clk;
    if ( RetValue1 == l_False )
    {
p->timeSatUnsat += Abc_Clock() - clk;
        pLits[0] = lit_neg( pLits[0] );
        RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 1 );
        assert( RetValue );
        // continue solving the other implication
        p->nSatCallsUnsat++;
    }
    else if ( RetValue1 == l_True )
    {
p->timeSatSat += Abc_Clock() - clk;
        if ( p->pPatWords )
            Ivy_FraigSavePattern( p );
        p->nSatCallsSat++;
        return 0;
    }
    else // if ( RetValue1 == l_Undef )
    {
p->timeSatFail += Abc_Clock() - clk;
/*
        if ( p->pParams->nBTLimitMiter > 1000 )
        {
            RetValue = Ivy_FraigCheckCone( p, p->pManFraig, p->pManFraig->pConst1, pNew, p->pParams->nBTLimitMiter );
            if ( RetValue != -1 )
                return RetValue;
        }
*/
        // mark the node as the failed node
        pNew->fFailTfo = 1;
        p->nSatFailsReal++;
        return -1;
    }

    // return SAT proof
    p->nSatProof++;
    return 1;
}